

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O1

void crnlib::split_vectors<crnlib::vec<3u,float>>
               (vec<3U,_float> (*vectors) [64],uint (*weights) [64],uint size,
               vec<3U,_float> (*result) [2])

{
  undefined8 uVar1;
  uint i_3;
  int iVar2;
  ulong uVar3;
  float *pfVar4;
  undefined8 *puVar5;
  vec<3U,_float> *pvVar6;
  ulong uVar7;
  long lVar8;
  float *pfVar9;
  uint i_2;
  undefined8 *puVar10;
  uint i_1;
  int iVar11;
  uint i;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint i_25;
  uint uVar16;
  float fVar17;
  double dVar18;
  double dVar19;
  float dist2;
  float fVar20;
  float fVar21;
  float fVar22;
  float dist2_2;
  float dist2_3;
  vec<3U,_float> axis;
  vec<3U,_float> centroid;
  vec<3U,_float> new_left_child;
  vec<3U,_float> result_8;
  vec<3U,_float> right_child;
  vec<3U,_float> left_child;
  vec<3U,_float> result_1;
  vec<3U,_float> new_right_child;
  vec<3U,_float> furthest;
  vec<3U,_float> opposite;
  double weightedDotProducts [64];
  vec<3U,_float> weightedVectors [64];
  undefined8 local_5f0;
  float local_5e8;
  undefined8 local_5e0;
  float local_5d8;
  undefined8 local_5d0;
  undefined4 local_5c8;
  float local_5c4 [3];
  undefined8 local_5b8;
  float local_5b0;
  undefined8 local_5a8;
  float local_5a0;
  undefined8 local_598;
  ulong uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined4 local_578;
  float local_570 [4];
  undefined8 local_560;
  float local_558;
  vec<3U,_float> *local_550;
  undefined8 local_548;
  float local_540;
  double adStack_538 [64];
  undefined8 local_338;
  undefined4 local_330 [192];
  
  local_5d8 = 0.0;
  local_5e0 = 0;
  uVar15 = (ulong)size;
  if (size == 0) {
    fVar17 = 0.0;
    dVar19 = 0.0;
  }
  else {
    dVar19 = 0.0;
    puVar5 = &local_338;
    uVar7 = 0;
    uVar3 = 0;
    pvVar6 = *vectors;
    do {
      uVar16 = (*weights)[uVar7];
      fVar17 = (float)uVar16;
      lVar12 = 0;
      do {
        *(float *)((long)&local_598 + lVar12 * 4) =
             ((vec<3U,_float> *)pvVar6->m_s)->m_s[lVar12] * fVar17;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      local_330[uVar7 * 3] = (float)uStack_590;
      *(undefined8 *)((long)&local_338 + uVar7 * 0xc) = local_598;
      lVar12 = 0;
      do {
        *(float *)((long)&local_5e0 + lVar12 * 4) =
             *(float *)((long)puVar5 + lVar12 * 4) + *(float *)((long)&local_5e0 + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      fVar20 = (*vectors)[uVar7].m_s[0];
      fVar20 = fVar20 * fVar20;
      lVar12 = 1;
      do {
        fVar21 = ((vec<3U,_float> *)pvVar6->m_s)->m_s[lVar12];
        fVar20 = fVar20 + fVar21 * fVar21;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      uVar3 = uVar3 + uVar16;
      dVar18 = (double)(fVar20 * fVar17);
      adStack_538[uVar7] = dVar18;
      dVar19 = dVar19 + dVar18;
      uVar7 = uVar7 + 1;
      pvVar6 = pvVar6 + 1;
      puVar5 = (undefined8 *)((long)puVar5 + 0xc);
    } while (uVar7 != uVar15);
    if ((long)uVar3 < 0) {
      fVar17 = (float)uVar3;
    }
    else {
      fVar17 = (float)(long)uVar3;
    }
  }
  fVar20 = (float)local_5e0 * (float)local_5e0;
  lVar12 = 1;
  do {
    fVar21 = *(float *)((long)&local_5e0 + lVar12 * 4);
    fVar20 = fVar20 + fVar21 * fVar21;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  lVar12 = 0;
  do {
    *(float *)((long)&local_5e0 + lVar12 * 4) =
         *(float *)((long)&local_5e0 + lVar12 * 4) * (1.0 / fVar17);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  (*result)[1].m_s[2] = local_5d8;
  *(undefined8 *)(*result)[1].m_s = local_5e0;
  *(undefined8 *)(*result)[0].m_s = local_5e0;
  (*result)[0].m_s[2] = local_5d8;
  if ((size != 1) && (0.0 < (float)(dVar19 - (double)(fVar20 / fVar17)))) {
    if (size != 0) {
      fVar20 = -1.0;
      uVar3 = 0;
      pvVar6 = *vectors;
      do {
        fVar21 = 0.0;
        lVar12 = 0;
        do {
          fVar22 = ((vec<3U,_float> *)pvVar6->m_s)->m_s[lVar12] -
                   *(float *)((long)&local_5e0 + lVar12 * 4);
          fVar21 = fVar21 + fVar22 * fVar22;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        if (fVar20 < fVar21) {
          local_558 = (*vectors)[uVar3].m_s[2];
          local_560 = *(undefined8 *)(*vectors)[uVar3].m_s;
          fVar20 = fVar21;
        }
        uVar3 = uVar3 + 1;
        pvVar6 = pvVar6 + 1;
      } while (uVar3 != uVar15);
    }
    if (size != 0) {
      fVar20 = -1.0;
      uVar3 = 0;
      pvVar6 = *vectors;
      do {
        fVar21 = 0.0;
        lVar12 = 0;
        do {
          fVar22 = ((vec<3U,_float> *)pvVar6->m_s)->m_s[lVar12] -
                   *(float *)((long)&local_560 + lVar12 * 4);
          fVar21 = fVar21 + fVar22 * fVar22;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        if (fVar20 < fVar21) {
          local_540 = (*vectors)[uVar3].m_s[2];
          local_548 = *(undefined8 *)(*vectors)[uVar3].m_s;
          fVar20 = fVar21;
        }
        uVar3 = uVar3 + 1;
        pvVar6 = pvVar6 + 1;
      } while (uVar3 != uVar15);
    }
    local_550 = *result + 1;
    lVar12 = 0;
    do {
      *(float *)((long)&local_598 + lVar12 * 4) =
           *(float *)((long)&local_560 + lVar12 * 4) + *(float *)((long)&local_5e0 + lVar12 * 4);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar12 = 0;
    do {
      *(float *)((long)&local_5a8 + lVar12 * 4) = *(float *)((long)&local_598 + lVar12 * 4) * 0.5;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar12 = 0;
    do {
      *(float *)((long)&local_598 + lVar12 * 4) =
           *(float *)((long)&local_548 + lVar12 * 4) + *(float *)((long)&local_5e0 + lVar12 * 4);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar12 = 0;
    do {
      *(float *)((long)&local_5b8 + lVar12 * 4) = *(float *)((long)&local_598 + lVar12 * 4) * 0.5;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    if (2 < size) {
      local_588 = 0;
      uStack_580 = 0;
      local_598 = 0;
      uStack_590 = 0;
      local_578 = 0;
      uVar3 = 0;
      pvVar6 = *vectors;
      do {
        lVar12 = 0;
        do {
          *(float *)((long)&local_5f0 + lVar12 * 4) =
               ((vec<3U,_float> *)pvVar6->m_s)->m_s[lVar12] -
               *(float *)((long)&local_5e0 + lVar12 * 4);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        uVar16 = (*weights)[uVar3];
        lVar12 = 0;
        do {
          *(float *)((long)&local_5d0 + lVar12 * 4) =
               *(float *)((long)&local_5f0 + lVar12 * 4) * (float)uVar16;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        lVar12 = 0;
        puVar5 = &local_5d0;
        puVar10 = &local_598;
        do {
          fVar20 = *(float *)((long)&local_5f0 + lVar12 * 4);
          lVar13 = -3;
          do {
            *(float *)((long)puVar10 + lVar13 * 4 + 0xc) =
                 *(float *)((long)puVar5 + lVar13 * 4 + 0xc) * fVar20 +
                 *(float *)((long)puVar10 + lVar13 * 4 + 0xc);
            lVar13 = lVar13 + 1;
          } while (lVar12 + lVar13 != 0);
          lVar12 = lVar12 + 1;
          puVar10 = puVar10 + 2;
          puVar5 = (undefined8 *)((long)puVar5 + 4);
        } while (lVar12 != 3);
        uVar3 = uVar3 + 1;
        pvVar6 = pvVar6 + 1;
      } while (uVar3 != uVar15);
      pfVar4 = (float *)&local_598;
      lVar12 = 0x24;
      lVar13 = 0;
      do {
        lVar8 = 0;
        pfVar9 = pfVar4;
        do {
          fVar20 = *pfVar9;
          *pfVar9 = fVar20 / fVar17;
          *(float *)((long)pfVar4 + lVar8) = fVar20 / fVar17;
          pfVar9 = pfVar9 + 1;
          lVar8 = lVar8 + 0xc;
        } while (lVar12 != lVar8);
        lVar13 = lVar13 + 1;
        pfVar4 = pfVar4 + 4;
        lVar12 = lVar12 + -0xc;
      } while (lVar13 != 3);
      lVar12 = 0;
      do {
        *(undefined4 *)((long)&local_5f0 + lVar12 * 4) = 0x3f800000;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      iVar2 = 0;
      do {
        lVar12 = 0;
        puVar5 = &local_598;
        fVar17 = 0.0;
        do {
          fVar20 = 0.0;
          lVar13 = 0;
          do {
            fVar20 = fVar20 + *(float *)((long)&local_5f0 + lVar13 * 4) *
                              *(float *)((long)puVar5 + lVar13 * 4);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          *(float *)((long)&local_5d0 + lVar12 * 4) = fVar20;
          fVar21 = fVar20;
          if ((lVar12 != 0) && (fVar21 = fVar17, fVar17 <= fVar20)) {
            fVar21 = fVar20;
          }
          lVar12 = lVar12 + 1;
          puVar5 = (undefined8 *)((long)puVar5 + 0xc);
          fVar17 = fVar21;
        } while (lVar12 != 3);
        if ((fVar21 != 0.0) || (NAN(fVar21))) {
          lVar12 = 0;
          do {
            *(float *)((long)&local_5d0 + lVar12 * 4) =
                 *(float *)((long)&local_5d0 + lVar12 * 4) * (1.0 / fVar21);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
        }
        local_5e8 = (float)local_5c8;
        local_5f0 = local_5d0;
        uVar1 = local_5f0;
        iVar2 = iVar2 + 1;
      } while (iVar2 != 10);
      local_5f0._0_4_ = (float)local_5d0;
      dVar19 = (double)((float)local_5f0 * (float)local_5f0);
      lVar12 = 1;
      do {
        fVar17 = *(float *)((long)&local_5f0 + lVar12 * 4);
        dVar19 = dVar19 + (double)(fVar17 * fVar17);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      local_5f0 = uVar1;
      if ((dVar19 != 0.0) || (NAN(dVar19))) {
        if (dVar19 < 0.0) {
          dVar19 = sqrt(dVar19);
        }
        else {
          dVar19 = SQRT(dVar19);
        }
        lVar12 = 0;
        do {
          *(float *)((long)&local_5f0 + lVar12 * 4) =
               *(float *)((long)&local_5f0 + lVar12 * 4) * (float)(1.0 / dVar19);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
      }
      dVar18 = 0.0;
      uVar3 = 0;
      local_5c8 = 0;
      local_5d0 = 0;
      local_570[2] = 0.0;
      local_570[0] = 0.0;
      local_570[1] = 0.0;
      puVar5 = &local_338;
      dVar19 = 0.0;
      pvVar6 = *vectors;
      do {
        uVar16 = (*weights)[uVar3];
        lVar12 = 0;
        do {
          local_5c4[lVar12] =
               ((vec<3U,_float> *)pvVar6->m_s)->m_s[lVar12] -
               *(float *)((long)&local_5e0 + lVar12 * 4);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        fVar17 = local_5c4[0] * (float)local_5f0;
        lVar12 = 1;
        do {
          fVar17 = fVar17 + local_5c4[lVar12] * *(float *)((long)&local_5f0 + lVar12 * 4);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        lVar12 = 0;
        if (0.0 <= fVar17) {
          do {
            local_570[lVar12] = *(float *)((long)puVar5 + lVar12 * 4) + local_570[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          dVar18 = dVar18 + (double)uVar16;
        }
        else {
          do {
            *(float *)((long)&local_5d0 + lVar12 * 4) =
                 *(float *)((long)puVar5 + lVar12 * 4) + *(float *)((long)&local_5d0 + lVar12 * 4);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          dVar19 = dVar19 + (double)uVar16;
        }
        uVar3 = uVar3 + 1;
        pvVar6 = pvVar6 + 1;
        puVar5 = (undefined8 *)((long)puVar5 + 0xc);
      } while (uVar3 != size + (size == 0));
      if ((0.0 < dVar19) && (0.0 < dVar18)) {
        lVar12 = 0;
        do {
          local_5c4[lVar12] = *(float *)((long)&local_5d0 + lVar12 * 4) * (float)(1.0 / dVar19);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        local_5a0 = local_5c4[2];
        local_5a8 = CONCAT44(local_5c4[1],local_5c4[0]);
        lVar12 = 0;
        do {
          local_5c4[lVar12] = local_570[lVar12] * (float)(1.0 / dVar18);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        local_5b0 = local_5c4[2];
        local_5b8 = CONCAT44(local_5c4[1],local_5c4[0]);
      }
    }
    fVar17 = 1e+10;
    iVar2 = 0;
    do {
      uStack_590 = uStack_590 & 0xffffffff00000000;
      local_598 = 0;
      local_5e8 = 0.0;
      local_5f0 = 0;
      if (size == 0) {
        dVar18 = 0.0;
        uVar7 = 0;
        uVar3 = 0;
        dVar19 = 0.0;
      }
      else {
        dVar19 = 0.0;
        uVar14 = 0;
        dVar18 = 0.0;
        uVar3 = 0;
        uVar7 = 0;
        puVar5 = &local_338;
        pvVar6 = *vectors;
        do {
          fVar20 = 0.0;
          lVar12 = 0;
          do {
            fVar21 = *(float *)((long)&local_5a8 + lVar12 * 4) -
                     ((vec<3U,_float> *)pvVar6->m_s)->m_s[lVar12];
            fVar20 = fVar20 + fVar21 * fVar21;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          fVar21 = 0.0;
          lVar12 = 0;
          do {
            fVar22 = *(float *)((long)&local_5b8 + lVar12 * 4) -
                     ((vec<3U,_float> *)pvVar6->m_s)->m_s[lVar12];
            fVar21 = fVar21 + fVar22 * fVar22;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          lVar12 = 0;
          if (fVar21 <= fVar20) {
            do {
              *(float *)((long)&local_5f0 + lVar12 * 4) =
                   *(float *)((long)puVar5 + lVar12 * 4) + *(float *)((long)&local_5f0 + lVar12 * 4)
              ;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            dVar19 = dVar19 + adStack_538[uVar14];
            uVar3 = uVar3 + (*weights)[uVar14];
          }
          else {
            do {
              *(float *)((long)&local_598 + lVar12 * 4) =
                   *(float *)((long)puVar5 + lVar12 * 4) + *(float *)((long)&local_598 + lVar12 * 4)
              ;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            dVar18 = dVar18 + adStack_538[uVar14];
            uVar7 = uVar7 + (*weights)[uVar14];
          }
          uVar14 = uVar14 + 1;
          pvVar6 = pvVar6 + 1;
          puVar5 = (undefined8 *)((long)puVar5 + 0xc);
        } while (uVar14 != uVar15);
      }
      iVar11 = 1;
      if ((uVar7 != 0) && (uVar3 != 0)) {
        fVar20 = (float)local_598 * (float)local_598;
        lVar12 = 1;
        do {
          fVar21 = *(float *)((long)&local_598 + lVar12 * 4);
          fVar20 = fVar20 + fVar21 * fVar21;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        fVar21 = (float)local_5f0 * (float)local_5f0;
        lVar12 = 1;
        do {
          fVar22 = *(float *)((long)&local_5f0 + lVar12 * 4);
          fVar21 = fVar21 + fVar22 * fVar22;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        lVar12 = 0;
        do {
          *(float *)((long)&local_598 + lVar12 * 4) =
               *(float *)((long)&local_598 + lVar12 * 4) * (1.0 / (float)uVar7);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        lVar12 = 0;
        do {
          *(float *)((long)&local_5f0 + lVar12 * 4) =
               *(float *)((long)&local_5f0 + lVar12 * 4) * (1.0 / (float)uVar3);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        local_5a0 = (float)uStack_590;
        local_5a8 = local_598;
        local_5b8 = local_5f0;
        local_5b0 = local_5e8;
        fVar20 = (float)(dVar18 - (double)(fVar20 / (float)uVar7)) +
                 (float)(dVar19 - (double)(fVar21 / (float)uVar3));
        iVar11 = 0x26;
        if (1e-05 <= fVar20) {
          fVar21 = (fVar17 - fVar20) / fVar20;
          uVar16 = -(uint)(fVar21 < 1e-05);
          fVar17 = (float)((uint)fVar17 & uVar16 | ~uVar16 & (uint)fVar20);
          iVar11 = 0;
          if (fVar21 < 1e-05) {
            iVar11 = 0x26;
          }
        }
      }
      if (iVar11 != 0) goto LAB_0017da72;
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0x400);
    iVar11 = 0x26;
LAB_0017da72:
    if (iVar11 == 0x26) {
      (*result)[0].m_s[2] = local_5a0;
      *(undefined8 *)(*result)[0].m_s = local_5a8;
      local_550->m_s[2] = local_5b0;
      *(undefined8 *)local_550->m_s = local_5b8;
    }
  }
  return;
}

Assistant:

void split_vectors(VectorType (&vectors)[64], uint (&weights)[64], uint size, VectorType (&result)[2])
    {
        VectorType weightedVectors[64];
        double weightedDotProducts[64];
        VectorType centroid(cClear);
        uint64 total_weight = 0;
        double ttsum = 0.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            const uint weight = weights[i];
            weightedVectors[i] = v * (float)weight;
            centroid += weightedVectors[i];
            total_weight += weight;
            weightedDotProducts[i] = v.dot(v) * weight;
            ttsum += weightedDotProducts[i];
        }
        float variance = (float)(ttsum - (centroid.dot(centroid) / total_weight));
        centroid *= (1.0f / total_weight);
        result[0] = result[1] = centroid;
        if (variance <= 0.0f || size == 1)
        {
            return;
        }
        VectorType furthest;
        double furthest_dist = -1.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            double dist = v.squared_distance(centroid);
            if (dist > furthest_dist)
            {
                furthest_dist = dist;
                furthest = v;
            }
        }
        VectorType opposite;
        double opposite_dist = -1.0f;
        for (uint i = 0; i < size; i++)
        {
            const VectorType& v = vectors[i];
            double dist = v.squared_distance(furthest);
            if (dist > opposite_dist)
            {
                opposite_dist = dist;
                opposite = v;
            }
        }
        VectorType left_child((furthest + centroid) * .5f);
        VectorType right_child((opposite + centroid) * .5f);
        if (size > 2)
        {
            const uint N = VectorType::num_elements;
            matrix<N, N, float> covar;
            covar.clear();
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i] - centroid;
                const VectorType w = v * (float)weights[i];
                for (uint x = 0; x < N; x++)
                {
                    for (uint y = x; y < N; y++)
                    {
                        covar[x][y] = covar[x][y] + v[x] * w[y];
                    }
                }
            }
            float divider = (float)total_weight;
            for (uint x = 0; x < N; x++)
            {
                for (uint y = x; y < N; y++)
                {
                    covar[x][y] /= divider;
                    covar[y][x] = covar[x][y];
                }
            }
            VectorType axis(1.0f);
            for (uint iter = 0; iter < 10; iter++)
            {
                VectorType x;
                double max_sum = 0;
                for (uint i = 0; i < N; i++)
                {
                    double sum = 0;
                    for (uint j = 0; j < N; j++)
                    {
                        sum += axis[j] * covar[i][j];
                    }
                    x[i] = (float)sum;
                    max_sum = i ? math::maximum(max_sum, sum) : sum;
                }
                if (max_sum != 0.0f)
                {
                    x *= (float)(1.0f / max_sum);
                }
                axis = x;
            }
            axis.normalize();
            VectorType new_left_child(0.0f);
            VectorType new_right_child(0.0f);
            double left_weight = 0.0f;
            double right_weight = 0.0f;
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i];
                const float weight = (float)weights[i];
                double t = (v - centroid) * axis;
                if (t < 0.0f)
                {
                    new_left_child += weightedVectors[i];
                    left_weight += weight;
                }
                else
                {
                    new_right_child += weightedVectors[i];
                    right_weight += weight;
                }
            }
            if ((left_weight > 0.0f) && (right_weight > 0.0f))
            {
                left_child = new_left_child * (float)(1.0f / left_weight);
                right_child = new_right_child * (float)(1.0f / right_weight);
            }
        }
        uint64 left_weight = 0;
        uint64 right_weight = 0;
        float prev_total_variance = 1e+10f;
        float left_variance = 0.0f;
        float right_variance = 0.0f;
        const uint cMaxLoops = 1024;
        for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++)
        {
            VectorType new_left_child(cClear);
            VectorType new_right_child(cClear);
            double left_ttsum = 0.0f;
            double right_ttsum = 0.0f;
            left_weight = 0;
            right_weight = 0;
            for (uint i = 0; i < size; i++)
            {
                const VectorType& v = vectors[i];
                double left_dist2 = left_child.squared_distance(v);
                double right_dist2 = right_child.squared_distance(v);
                if (left_dist2 < right_dist2)
                {
                    new_left_child += weightedVectors[i];
                    left_ttsum += weightedDotProducts[i];
                    left_weight += weights[i];
                }
                else
                {
                    new_right_child += weightedVectors[i];
                    right_ttsum += weightedDotProducts[i];
                    right_weight += weights[i];
                }
            }
            if ((!left_weight) || (!right_weight))
            {
                return;
            }
            left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
            right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));
            new_left_child *= (1.0f / left_weight);
            new_right_child *= (1.0f / right_weight);
            left_child = new_left_child;
            right_child = new_right_child;
            float total_variance = left_variance + right_variance;
            if (total_variance < .00001f)
            {
                break;
            }
            if (((prev_total_variance - total_variance) / total_variance) < .00001f)
            {
                break;
            }
            prev_total_variance = total_variance;
        }
        result[0] = left_child;
        result[1] = right_child;
    }